

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

__pid_t __thiscall
so_5::disp::mpmc_queue_traits::combined_lock::actual_cond_t::wait
          (actual_cond_t *this,void *__stat_loc)

{
  long lVar1;
  __pid_t extraout_EAX;
  __pid_t extraout_EAX_00;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> mutex_lock;
  unique_lock<std::mutex> local_20;
  
  this->m_signaled = false;
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->m_waiting_time).__r;
  do {
    (this->m_spinlock->m_flag).super___atomic_flag_base._M_i = false;
    sched_yield();
    spinlock_t<so_5::yield_backoff_t>::lock(this->m_spinlock);
    if (this->m_signaled != false) {
      return extraout_EAX;
    }
    lVar3 = std::chrono::_V2::system_clock::now();
  } while (lVar3 < lVar2 + lVar1);
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m_mutex);
  (this->m_spinlock->m_flag).super___atomic_flag_base._M_i = false;
  std::condition_variable::
  wait<so_5::disp::mpmc_queue_traits::combined_lock::actual_cond_t::wait()::_lambda()_1_>
            (&this->m_condition,&local_20,(anon_class_8_1_8991fb9c)this);
  spinlock_t<so_5::yield_backoff_t>::lock(this->m_spinlock);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_EAX_00;
}

Assistant:

SO_5_NOEXCEPT override
			{
				using hrc = std::chrono::high_resolution_clock;

				/*
				 * NOTE: spinlock of the parent lock object is already
				 * acquired by the current thread.
				 */
				m_signaled = false;

				//
				// Busy waiting stage.
				//

				// Limitation for busy waiting stage.
				const auto stop_point = hrc::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							return;
					}
				while( stop_point > hrc::now() );

				// If we are here then busy waiting stage failed (condition
				// is not signaled yet) and we must go to long-time waiting.
				//
				// NOTE: spinlock of the parent lock object is acquired by
				// the current thread.

				//
				// Long-time waiting stage.
				//

				// Personal mutex object must be acquired.
				std::unique_lock< std::mutex > mutex_lock{ m_mutex };
				// Spinlock of the parent lock can be released now.
				m_spinlock.unlock();

				// Wait on condition_variable.
				m_condition.wait( mutex_lock, [this]{ return m_signaled; } );

				// Spinlock must be reacquired to return the parent lock
				// in the state at the call to wait().
				m_spinlock.lock();
			}